

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void quat2R(Vector4d *q,Matrix3d *R)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *s;
  double q4;
  double q3;
  double q2;
  double q1;
  Index in_stack_ffffffffffffff08;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *in_stack_ffffffffffffff10;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffff18;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffff20;
  
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator()
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator()
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator()
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator()
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (in_stack_ffffffffffffff18,(Scalar *)in_stack_ffffffffffffff10);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_ffffffffffffff20,(Scalar *)in_stack_ffffffffffffff18);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_ffffffffffffff20,(Scalar *)in_stack_ffffffffffffff18);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_ffffffffffffff20,(Scalar *)in_stack_ffffffffffffff18);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
            (in_stack_ffffffffffffff20,(Scalar *)in_stack_ffffffffffffff18);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                   (in_stack_ffffffffffffff20,(Scalar *)in_stack_ffffffffffffff18);
  s = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                (this,(Scalar *)in_stack_ffffffffffffff18);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(this,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(this,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x1d2c05);
  return;
}

Assistant:

void quat2R(Eigen::Vector4d const q, Eigen::Matrix3d & R) {
	double q1 = q(0);
	double q2 = q(1);
	double q3 = q(2);
	double q4 = q(3);

	R << q1*q1 + q2*q2 - q3*q3 - q4*q4, 2 * q2*q3 - 2 * q1*q4, 2 * q1*q3 + 2 * q2*q4,
		2 * q1*q4 + 2 * q2*q3, q1*q1 - q2*q2 + q3*q3 - q4*q4, 2 * q3*q4 - 2 * q1*q2,
		2 * q2*q4 - 2 * q1*q3, 2 * q1*q2 + 2 * q3*q4, q1*q1 - q2*q2 - q3*q3 + q4*q4;

}